

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Print.cpp
# Opt level: O0

void __thiscall wasm::PrintSExpression::visitIf(PrintSExpression *this,If *curr)

{
  If *curr_local;
  PrintSExpression *this_local;
  
  this->controlFlowDepth = this->controlFlowDepth + 1;
  std::operator<<(this->o,'(');
  printExpressionContents(this,(Expression *)curr);
  incIndent(this);
  printFullLine(this,curr->condition);
  doIndent(this->o,this->indent);
  std::operator<<(this->o,"(then");
  incIndent(this);
  maybePrintImplicitBlock(this,curr->ifTrue);
  decIndent(this);
  std::operator<<(this->o,this->maybeNewLine);
  if (curr->ifFalse != (Expression *)0x0) {
    doIndent(this->o,this->indent);
    std::operator<<(this->o,"(else");
    incIndent(this);
    printDebugDelimiterLocation(this,(Expression *)curr,0);
    maybePrintImplicitBlock(this,curr->ifFalse);
    decIndent(this);
    std::operator<<(this->o,this->maybeNewLine);
  }
  decIndent(this);
  if ((this->full & 1U) != 0) {
    std::operator<<(this->o," ;; end if");
  }
  this->controlFlowDepth = this->controlFlowDepth + -1;
  return;
}

Assistant:

void PrintSExpression::visitIf(If* curr) {
  controlFlowDepth++;
  o << '(';
  printExpressionContents(curr);
  incIndent();
  printFullLine(curr->condition);
  doIndent(o, indent);
  o << "(then";
  incIndent();
  maybePrintImplicitBlock(curr->ifTrue);
  decIndent();
  o << maybeNewLine;
  if (curr->ifFalse) {
    doIndent(o, indent);
    o << "(else";
    incIndent();
    // Note: debug info here is not used as LLVM does not emit ifs, and since
    // LLVM is the main source of DWARF, effectively we never encounter ifs
    // with DWARF.
    printDebugDelimiterLocation(curr, BinaryLocations::Else);
    maybePrintImplicitBlock(curr->ifFalse);
    decIndent();
    o << maybeNewLine;
  }
  decIndent();
  if (full) {
    o << " ;; end if";
  }
  controlFlowDepth--;
}